

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmState *pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  cmGlobalGenerator *this_00;
  ostream *poVar9;
  string local_f0;
  string output;
  string cachePath;
  string projName;
  string local_50;
  
  paVar1 = &cachePath.field_2;
  cachePath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cachePath,"");
  SetHomeDirectory(this,&cachePath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != paVar1) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  cachePath._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cachePath,"");
  SetHomeOutputDirectory(this,&cachePath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != paVar1) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmsys::SystemTools::FileIsDirectory(dir);
  if (bVar5) {
    FindCacheFile(&cachePath,dir);
    bVar5 = LoadCache(this,&cachePath);
    if (bVar5) {
      pcVar3 = this->State;
      paVar2 = &output.field_2;
      output._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR","");
      pcVar7 = cmState::GetCacheEntryValue(pcVar3,&output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != paVar2) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      if (pcVar7 == (char *)0x0) {
        iVar6 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
      }
      else {
        output._M_dataplus._M_p = (pointer)paVar2;
        sVar8 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)&output,pcVar7,pcVar7 + sVar8);
        this_00 = CreateGlobalGenerator(this,&output);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output._M_dataplus._M_p != &output.field_2) {
          operator_delete(output._M_dataplus._M_p,
                          CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                   output.field_2._M_local_buf[0]) + 1);
        }
        if (this_00 == (cmGlobalGenerator *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"",0x25);
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
          iVar6 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
        }
        else {
          output._M_string_length = 0;
          output.field_2._M_local_buf[0] = '\0';
          projName._M_dataplus._M_p = (pointer)&projName.field_2;
          projName._M_string_length = 0;
          projName.field_2._M_local_buf[0] = '\0';
          pcVar3 = this->State;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          output._M_dataplus._M_p = (pointer)&output.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"CMAKE_PROJECT_NAME","");
          pcVar7 = cmState::GetCacheEntryValue(pcVar3,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          sVar4 = projName._M_string_length;
          if (pcVar7 == (char *)0x0) {
            iVar6 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",
                       0x32);
          }
          else {
            strlen(pcVar7);
            std::__cxx11::string::_M_replace((ulong)&projName,0,(char *)sVar4,(ulong)pcVar7);
            pcVar3 = this->State;
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CMAKE_VERBOSE_MAKEFILE","");
            pcVar7 = cmState::GetCacheEntryValue(pcVar3,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if (pcVar7 == (char *)0x0) {
              bVar5 = false;
            }
            else {
              bVar5 = cmSystemTools::IsOn(pcVar7);
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
            iVar6 = cmGlobalGenerator::Build
                              (this_00,&local_f0,dir,&projName,target,&output,&local_50,config,clean
                               ,false,bVar5,0.0,OUTPUT_PASSTHROUGH,nativeOptions);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projName._M_dataplus._M_p != &projName.field_2) {
            operator_delete(projName._M_dataplus._M_p,
                            CONCAT71(projName.field_2._M_allocated_capacity._1_7_,
                                     projName.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != &output.field_2) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
          (*this_00->_vptr_cmGlobalGenerator[1])();
        }
      }
    }
    else {
      iVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cachePath._M_dataplus._M_p != paVar1) {
      operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is not a directory\n",0x14);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int cmake::Build(const std::string& dir, const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions, bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  const char* cachedGenerator =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  CM_AUTO_PTR<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if (!gen.get()) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << cachedGenerator
              << "\"\n";
    return 1;
  }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
    this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if (cachedVerbose) {
    verbose = cmSystemTools::IsOn(cachedVerbose);
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" +
    GetCMakeFilesDirectoryPostSlash() +
    cmGlobalVisualStudio8Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList.c_str()) &&
      !cmakeCheckStampList(stampList.c_str(), false)) {

    // Correctly initialize the home (=source) and home output (=binary)
    // directories, which is required for running the generation step.
    std::string homeOrig = this->GetHomeDirectory();
    std::string homeOutputOrig = this->GetHomeOutputDirectory();
    this->SetDirectoriesFromFile(cachePath.c_str());

    this->AddScriptingCommands();
    this->AddProjectCommands();

    int ret = this->Configure();
    if (ret) {
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.");
      return ret;
    }
    ret = this->Generate();
    if (ret) {
      cmSystemTools::Message("CMake Generate step failed.  "
                             "Build files cannot be regenerated correctly.");
      return ret;
    }
    std::string message = "Build files have been written to: ";
    message += this->GetHomeOutputDirectory();
    this->UpdateProgress(message.c_str(), -1);

    // Restore the previously set directories to their original value.
    this->SetHomeDirectory(homeOrig);
    this->SetHomeOutputDirectory(homeOutputOrig);
  }
#endif

  return gen->Build("", dir, projName, target, output, "", config, clean,
                    false, verbose, 0, cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}